

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString __thiscall SimpleString::operator+(SimpleString *this,SimpleString *rhs)

{
  char *pcVar1;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  SimpleString SVar2;
  SimpleString *rhs_local;
  SimpleString *this_local;
  SimpleString *t;
  
  pcVar1 = getBuffer(rhs);
  SimpleString(this,pcVar1);
  pcVar1 = getBuffer(in_RDX);
  operator+=(this,pcVar1);
  SVar2.bufferSize_ = extraout_RDX;
  SVar2.buffer_ = (char *)this;
  return SVar2;
}

Assistant:

SimpleString SimpleString::operator+(const SimpleString& rhs) const
{
    SimpleString t(getBuffer());
    t += rhs.getBuffer();
    return t;
}